

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

size_t btokBAuthTStep5_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  ulong in_RDI;
  
  sVar1 = beltHash_keep();
  sVar2 = beltMAC_keep();
  sVar3 = beltCFB_keep();
  sVar4 = ecpIsOnA_deep(in_RDI,in_RSI);
  sVar5 = ecAddMulA_deep(in_RDI,in_RDX,in_RCX,2,in_RDI,(in_RDI >> 1) + 1);
  sVar1 = utilMax(6,sVar1,sVar2,sVar3,in_RSI,sVar4,sVar5);
  return (in_RDI * 3 + (in_RDI >> 1) + 1) * 8 + sVar1;
}

Assistant:

static size_t btokBAuthTStep5_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(3 * n + n / 2 + 1) +
		utilMax(6,
			beltHash_keep(),
			beltMAC_keep(),
			beltCFB_keep(),
			f_deep,
			ecpIsOnA_deep(n, f_deep),
			ecAddMulA_deep(n, ec_d, ec_deep, 2, n, n / 2 + 1));
}